

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

void __thiscall
glcts::ViewportArray::DepthRangeAPI::compareDepthRanges<double>
          (DepthRangeAPI *this,vector<double,_std::allocator<double>_> *left,
          vector<double,_std::allocator<double>_> *right,GLchar *description,bool *out_result)

{
  double *pdVar1;
  ostringstream *this_00;
  double dVar2;
  pointer pdVar3;
  MessageBuilder *pMVar4;
  ulong uVar5;
  long lVar6;
  undefined1 local_1b0 [384];
  
  this_00 = (ostringstream *)(local_1b0 + 8);
  lVar6 = 0;
  for (uVar5 = 0;
      pdVar3 = (left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(left->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar3 >> 3);
      uVar5 = uVar5 + 1) {
    dVar2 = *(double *)((long)pdVar3 + lVar6);
    pdVar1 = (double *)
             ((long)(right->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar6);
    if ((dVar2 != *pdVar1) || (NAN(dVar2) || NAN(*pdVar1))) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Test case: ");
      std::operator<<((ostream *)this_00,description);
      std::operator<<((ostream *)this_00," Invalid values [");
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<((ostream *)this_00,"] ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (double *)
                          ((long)(left->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                 .super__Vector_impl_data._M_start + lVar6));
      std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>," ");
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(double *)
                                 ((long)(right->super__Vector_base<double,_std::allocator<double>_>)
                                        ._M_impl.super__Vector_impl_data._M_start + lVar6));
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      *out_result = false;
    }
    lVar6 = lVar6 + 8;
  }
  return;
}

Assistant:

void DepthRangeAPI::compareDepthRanges(std::vector<T>& left, std::vector<T>& right, const GLchar* description,
									   bool& out_result)
{
	for (size_t i = 0; i < left.size(); ++i)
	{
		if (left[i] != right[i])
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << description
												<< " Invalid values [" << i << "] " << left[i] << " " << right[i]
												<< tcu::TestLog::EndMessage;
			out_result = false;
		}
	}
}